

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O0

void __thiscall
duckdb::WindowBoundariesState::Bounds
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,
          optional_ptr<duckdb::WindowCursor,_true> range,idx_t count,
          WindowInputExpression *boundary_start,WindowInputExpression *boundary_end,
          ValidityMask *partition_mask,ValidityMask *order_mask)

{
  size_type sVar1;
  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
  *in_RCX;
  optional_ptr<duckdb::WindowCursor,_true> in_RDX;
  DataChunk *in_RSI;
  ValidityMask *in_RDI;
  WindowBoundariesState *in_R8;
  WindowBoundariesState *in_R9;
  undefined1 uVar2;
  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
  *in_stack_00000018;
  bool is_jump;
  ValidityMask *in_stack_00000180;
  WindowInputExpression *in_stack_00000188;
  idx_t in_stack_00000190;
  idx_t in_stack_00000198;
  DataChunk *in_stack_000001a0;
  WindowBoundariesState *in_stack_000001a8;
  optional_ptr<duckdb::WindowCursor,_true> in_stack_000001b0;
  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
  *in_stack_ffffffffffffff78;
  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
  *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  ValidityMask *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 is_jump_00;
  unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
  *in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffca;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffffcb;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffffcc;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 uVar6;
  undefined1 uVar7;
  ValidityMask *order_mask_00;
  
  order_mask_00 = in_RDI;
  DataChunk::Reset((DataChunk *)in_RDX.ptr);
  uVar2 = (WindowCursor *)
          in_RDI[3].super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != in_RDX.ptr;
  if ((bool)uVar2) {
    in_RDI[3].super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)in_RDX.ptr;
  }
  uVar7 = 0;
  sVar1 = ::std::
          unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
          ::count(in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  if (sVar1 != 0) {
    PartitionBegin(in_R9,(DataChunk *)
                         CONCAT17(uVar2,CONCAT16(uVar7,CONCAT15(in_stack_ffffffffffffffcd,
                                                                CONCAT14(in_stack_ffffffffffffffcc,
                                                                         CONCAT13(
                                                  in_stack_ffffffffffffffcb,
                                                  CONCAT12(in_stack_ffffffffffffffca,
                                                           in_stack_ffffffffffffffc8)))))),
                   (idx_t)in_stack_ffffffffffffffc0,
                   CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                   SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0),
                   (ValidityMask *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  }
  uVar6 = 1;
  sVar1 = ::std::
          unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
          ::count(in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  if (sVar1 != 0) {
    PartitionEnd((WindowBoundariesState *)in_RDX.ptr,(DataChunk *)in_R8,(idx_t)in_R9,
                 CONCAT17(uVar2,CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(in_stack_ffffffffffffffcc,
                                                                       CONCAT13(
                                                  in_stack_ffffffffffffffcb,
                                                  CONCAT12(in_stack_ffffffffffffffca,
                                                           in_stack_ffffffffffffffc8)))))),
                 SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0),
                 (ValidityMask *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  uVar5 = 2;
  sVar1 = ::std::
          unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
          ::count(in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  if (sVar1 != 0) {
    in_stack_ffffffffffffff78 = in_stack_00000018;
    PeerBegin(in_R9,(DataChunk *)
                    CONCAT17(uVar2,CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,CONCAT13(
                                                  in_stack_ffffffffffffffcb,
                                                  CONCAT12(in_stack_ffffffffffffffca,
                                                           in_stack_ffffffffffffffc8)))))),
              (idx_t)in_stack_ffffffffffffffc0,
              CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
              SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0),
              (ValidityMask *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
              (ValidityMask *)in_RDX.ptr);
  }
  uVar4 = 3;
  sVar1 = ::std::
          unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
          ::count(in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  if (sVar1 != 0) {
    PeerEnd((WindowBoundariesState *)in_RDX.ptr,(DataChunk *)in_R8,(idx_t)in_R9,
            CONCAT17(uVar2,CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,CONCAT13(uVar4,CONCAT12(
                                                  in_stack_ffffffffffffffca,
                                                  in_stack_ffffffffffffffc8)))))),
            (ValidityMask *)in_stack_ffffffffffffffc0,
            (ValidityMask *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  uVar3 = 4;
  sVar1 = ::std::
          unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
          ::count(in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  if (sVar1 != 0) {
    in_stack_ffffffffffffff78 = in_stack_00000018;
    in_stack_ffffffffffffff80 = in_RCX;
    in_stack_ffffffffffffffc0 = in_RCX;
    ValidBegin(in_R8,(DataChunk *)in_R9,
               CONCAT17(uVar2,CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,CONCAT13(uVar4,CONCAT12(
                                                  uVar3,in_stack_ffffffffffffffc8)))))),
               (idx_t)in_RCX,(bool)in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb0,order_mask_00
               ,in_RDX);
  }
  is_jump_00 = 5;
  sVar1 = ::std::
          unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
          ::count(in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  if (sVar1 != 0) {
    in_stack_ffffffffffffff80 = in_RCX;
    ValidEnd(in_R8,(DataChunk *)in_R9,
             CONCAT17(uVar2,CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,CONCAT13(uVar4,CONCAT12(
                                                  uVar3,in_stack_ffffffffffffffc8)))))),
             (idx_t)in_stack_ffffffffffffffc0,(bool)is_jump_00,(ValidityMask *)in_RCX,order_mask_00,
             in_RDX);
    in_stack_ffffffffffffff78 = in_stack_00000018;
  }
  sVar1 = ::std::
          unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
          ::count(in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  if (sVar1 != 0) {
    FrameBegin(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
               in_stack_00000188,in_stack_00000180,in_stack_000001b0);
    in_stack_ffffffffffffff78 = in_RCX;
  }
  sVar1 = ::std::
          unordered_set<duckdb::WindowBounds,_duckdb::WindowBoundsHash,_std::equal_to<duckdb::WindowBounds>,_std::allocator<duckdb::WindowBounds>_>
          ::count(in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  if (sVar1 != 0) {
    FrameEnd(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
             in_stack_00000188,in_stack_00000180,in_stack_000001b0);
  }
  in_RDI[3].super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           ((long)&(in_R8->required)._M_h._M_buckets +
           (long)in_RDI[3].super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
  DataChunk::SetCardinality(in_RSI,(idx_t)in_R8);
  return;
}

Assistant:

void WindowBoundariesState::Bounds(DataChunk &bounds, idx_t row_idx, optional_ptr<WindowCursor> range,
                                   const idx_t count, WindowInputExpression &boundary_start,
                                   WindowInputExpression &boundary_end, const ValidityMask &partition_mask,
                                   const ValidityMask &order_mask) {
	bounds.Reset();
	D_ASSERT(bounds.ColumnCount() == 8);

	//	Have we jumped from the previous position?
	const auto is_jump = (next_pos != row_idx);
	if (is_jump) {
		next_pos = row_idx;
	}

	if (required.count(PARTITION_BEGIN)) {
		PartitionBegin(bounds, row_idx, count, is_jump, partition_mask);
	}
	if (required.count(PARTITION_END)) {
		PartitionEnd(bounds, row_idx, count, is_jump, partition_mask);
	}
	if (required.count(PEER_BEGIN)) {
		PeerBegin(bounds, row_idx, count, is_jump, partition_mask, order_mask);
	}
	if (required.count(PEER_END)) {
		PeerEnd(bounds, row_idx, count, partition_mask, order_mask);
	}
	if (required.count(VALID_BEGIN)) {
		ValidBegin(bounds, row_idx, count, is_jump, partition_mask, order_mask, range);
	}
	if (required.count(VALID_END)) {
		ValidEnd(bounds, row_idx, count, is_jump, partition_mask, order_mask, range);
	}
	if (required.count(FRAME_BEGIN)) {
		FrameBegin(bounds, row_idx, count, boundary_start, order_mask, range);
	}
	if (required.count(FRAME_END)) {
		FrameEnd(bounds, row_idx, count, boundary_end, order_mask, range);
	}
	next_pos += count;

	bounds.SetCardinality(count);
}